

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O3

void __thiscall t_html_generator::print_fn_args_doc(t_html_generator *this,t_function *tfunction)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  bool bVar4;
  pointer pptVar5;
  pointer pptVar6;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  string local_80;
  vector<t_field_*,_std::allocator<t_field_*>_> local_60;
  vector<t_field_*,_std::allocator<t_field_*>_> local_48;
  
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            (&local_48,&tfunction->arglist_->members_);
  pptVar6 = local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = false;
    pptVar5 = local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (((*pptVar5)->super_t_doc).has_doc_ == true) {
        bVar4 = (bool)(bVar4 | ((*pptVar5)->super_t_doc).doc_._M_string_length != 0);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (bVar4) {
      poVar1 = &this->f_out_;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"<br/><h4 id=\"Parameters_",0x18);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(this->super_t_generator).service_name_._M_dataplus._M_p
                          ,(this->super_t_generator).service_name_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(tfunction->name_)._M_dataplus._M_p,
                          (tfunction->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">Parameters</h4>",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"<table class=\"table-bordered table-striped table-condensed\">",
                 0x3c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "<thead><tr><th>Name</th><th>Description</th></tr></thead><tbody>",0x40);
      if (pptVar6 !=
          local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<tr><td>",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,((*pptVar6)->name_)._M_dataplus._M_p,
                     ((*pptVar6)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</td><td>",9);
          escape_html(&local_80,this,&((*pptVar6)->super_t_doc).doc_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_80._M_dataplus._M_p,local_80._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</td></tr>",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          pptVar6 = pptVar6 + 1;
        } while (pptVar6 !=
                 local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</tbody></table>",0x10);
    }
  }
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            (&local_60,&tfunction->xceptions_->members_);
  pptVar6 = local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = false;
    pptVar5 = local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (((*pptVar5)->super_t_doc).has_doc_ == true) {
        bVar4 = (bool)(bVar4 | ((*pptVar5)->super_t_doc).doc_._M_string_length != 0);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (bVar4) {
      poVar1 = &this->f_out_;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"<br/><h4 id=\"Exceptions_",0x18);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(this->super_t_generator).service_name_._M_dataplus._M_p
                          ,(this->super_t_generator).service_name_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(tfunction->name_)._M_dataplus._M_p,
                          (tfunction->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\">Exceptions</h4>",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"<table class=\"table-bordered table-striped table-condensed\">",
                 0x3c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "<thead><tr><th>Type</th><th>Description</th></tr></thead><tbody>",0x40);
      if (pptVar6 !=
          local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<tr><td>",8);
          iVar2 = (*((*pptVar6)->type_->super_t_doc)._vptr_t_doc[3])();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,*(char **)CONCAT44(extraout_var,iVar2),
                     ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</td><td>",9);
          escape_html(&local_80,this,&((*pptVar6)->super_t_doc).doc_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_80._M_dataplus._M_p,local_80._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</td></tr>",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          pptVar6 = pptVar6 + 1;
        } while (pptVar6 !=
                 local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</tbody></table>",0x10);
    }
  }
  if (local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_html_generator::print_fn_args_doc(t_function* tfunction) {
  bool has_docs = false;
  vector<t_field*> args = tfunction->get_arglist()->get_members();
  vector<t_field*>::iterator arg_iter = args.begin();
  if (arg_iter != args.end()) {
    for (; arg_iter != args.end(); arg_iter++) {
      if ((*arg_iter)->has_doc() && !(*arg_iter)->get_doc().empty())
        has_docs = true;
    }
    if (has_docs) {
      arg_iter = args.begin();
      f_out_ << "<br/><h4 id=\"Parameters_" << service_name_ << "_" << tfunction->get_name()
             << "\">Parameters</h4>" << endl;
      f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
      f_out_ << "<thead><tr><th>Name</th><th>Description</th></tr></thead><tbody>";
      for (; arg_iter != args.end(); arg_iter++) {
        f_out_ << "<tr><td>" << (*arg_iter)->get_name();
        f_out_ << "</td><td>";
        f_out_ << escape_html((*arg_iter)->get_doc());
        f_out_ << "</td></tr>" << endl;
      }
      f_out_ << "</tbody></table>";
    }
  }

  has_docs = false;
  vector<t_field*> excepts = tfunction->get_xceptions()->get_members();
  vector<t_field*>::iterator ex_iter = excepts.begin();
  if (ex_iter != excepts.end()) {
    for (; ex_iter != excepts.end(); ex_iter++) {
      if ((*ex_iter)->has_doc() && !(*ex_iter)->get_doc().empty())
        has_docs = true;
    }
    if (has_docs) {
      ex_iter = excepts.begin();
      f_out_ << "<br/><h4 id=\"Exceptions_" << service_name_ << "_" << tfunction->get_name()
             << "\">Exceptions</h4>" << endl;
      f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
      f_out_ << "<thead><tr><th>Type</th><th>Description</th></tr></thead><tbody>";
      for (; ex_iter != excepts.end(); ex_iter++) {
        f_out_ << "<tr><td>" << (*ex_iter)->get_type()->get_name();
        f_out_ << "</td><td>";
        f_out_ << escape_html((*ex_iter)->get_doc());
        f_out_ << "</td></tr>" << endl;
      }
      f_out_ << "</tbody></table>";
    }
  }
}